

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslconfiguration.cpp
# Opt level: O0

void __thiscall
QSslConfiguration::setBackendConfiguration
          (QSslConfiguration *this,QMap<QByteArray,_QVariant> *backendConfiguration)

{
  QMap<QByteArray,_QVariant> *in_RSI;
  QMap<QByteArray,_QVariant> *this_00;
  
  this_00 = in_RSI;
  QSharedDataPointer<QSslConfigurationPrivate>::operator->
            ((QSharedDataPointer<QSslConfigurationPrivate> *)in_RSI);
  QMap<QByteArray,_QVariant>::operator=(this_00,in_RSI);
  return;
}

Assistant:

void QSslConfiguration::setBackendConfiguration(const QMap<QByteArray, QVariant> &backendConfiguration)
{
    d->backendConfig = backendConfiguration;
}